

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::tessellation::GraphicsPipelineBuilder::build
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkPipelineLayout pipelineLayout,VkRenderPass renderPass)

{
  int iVar1;
  int iVar2;
  VkPrimitiveTopology VVar3;
  ulong uVar4;
  uint uVar5;
  VkPipelineDepthStencilStateCreateInfo *pVVar6;
  bool bVar7;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> dynamicStates;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  VkRect2D scissor;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkViewport res;
  VkPipelineDynamicStateCreateInfo pipelineDynamicStateInfo;
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_2f8;
  undefined1 local_2e0 [24];
  undefined8 *local_2c8;
  VkBool32 local_2c0;
  undefined1 *local_2b8;
  DeviceInterface *local_2b0;
  VkDevice local_2a8;
  undefined1 local_2a0 [48];
  undefined8 local_270;
  deUint32 local_268;
  deUint32 local_264;
  pointer local_260;
  VkStencilOp local_258;
  pointer local_250;
  VkPipelineInputAssemblyStateCreateInfo local_248;
  undefined1 local_228 [56];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  VkStencilOp local_1e0;
  VkStencilOp local_1dc;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [40];
  undefined1 local_178 [24];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined1 local_100 [32];
  uint local_e0 [8];
  VkGraphicsPipelineCreateInfo local_c0;
  
  local_2a0._40_4_ = 0x13;
  local_270._0_4_ = VK_STENCIL_OP_KEEP;
  local_270._4_4_ = VK_COMPARE_OP_NEVER;
  local_268 = 0;
  local_260 = (pointer)(this->m_vertexInputBindings).
                       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_vertexInputBindings).
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_260;
  if (uVar4 == 0) {
    local_260 = (pointer)0x0;
  }
  local_264 = (int)(uVar4 >> 2) * -0x55555555;
  local_250 = (this->m_vertexInputAttributes).
              super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_vertexInputAttributes).
                super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_250;
  if (uVar4 == 0) {
    local_250 = (pointer)0x0;
  }
  local_258 = (VkStencilOp)(uVar4 >> 4);
  VVar3 = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
  if ((this->m_shaderStageFlags & 2) == 0) {
    VVar3 = this->m_primitiveTopology;
  }
  local_248.pNext = (void *)0x0;
  local_248.primitiveRestartEnable = 0;
  local_248._28_4_ = 0;
  local_248.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_248._4_4_ = 0;
  local_248._16_8_ = (ulong)VVar3 << 0x20;
  local_2a0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_2a0._8_8_ = (void *)0x0;
  local_2a0._16_4_ = VK_COMPARE_OP_NEVER;
  local_2a0._20_4_ = this->m_patchControlPoints;
  iVar1 = (this->m_renderSize).m_data[0];
  iVar2 = (this->m_renderSize).m_data[1];
  local_2a0._32_8_ = *(undefined8 *)(this->m_renderSize).m_data;
  uStack_1b0 = CONCAT44((float)iVar2,(float)iVar1);
  local_1b8 = 0;
  local_1a8 = 0x3f80000000000000;
  local_2a0._24_4_ = 0;
  local_2a0._28_4_ = 0;
  if ((iVar1 < 1) || (iVar2 < 1)) {
    local_2c8 = (undefined8 *)0x0;
    bVar7 = false;
    local_2b8 = (undefined1 *)0x0;
  }
  else {
    local_2c8 = &local_1b8;
    local_2b8 = local_2a0 + 0x18;
    bVar7 = true;
  }
  local_2c0 = 1;
  local_2e0._16_4_ = 0;
  local_2e0._20_4_ = 1;
  local_2e0._8_8_ = (void *)0x0;
  local_2e0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  uVar5 = this->m_shaderStageFlags & 0x10;
  local_228._48_4_ = 0x17;
  local_1e0 = uVar5 >> 4 ^ VK_STENCIL_OP_ZERO;
  local_1f0._0_4_ = 0;
  local_1f0._4_4_ = 0;
  uStack_1e8._0_4_ = 0;
  uStack_1e8._4_4_ = VK_STENCIL_OP_KEEP;
  local_1dc = VK_STENCIL_OP_KEEP;
  local_1d8._0_4_ = this->m_cullModeFlags;
  local_1d8._4_4_ = this->m_frontFace;
  local_1d0._0_4_ = 0;
  local_1d0._4_4_ = 0;
  uStack_1c8._0_4_ = 0.0;
  uStack_1c8._4_4_ = 0.0;
  local_1c0 = 0x3f800000;
  local_228._8_8_ = (void *)0x0;
  local_228._24_4_ = 0;
  local_228._28_4_ = VK_COMPARE_OP_NEVER;
  local_228._32_4_ = 0;
  local_228._36_4_ = 0;
  local_228._40_4_ = VK_STENCIL_OP_KEEP;
  local_228._44_4_ = VK_STENCIL_OP_KEEP;
  local_228._0_8_ = 0x18;
  local_228._16_4_ = 0;
  local_228._20_4_ = 1;
  local_178._16_4_ = 0x19;
  local_160._0_4_ = 0;
  local_160._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_158._0_4_ = VK_STENCIL_OP_KEEP;
  uStack_158._4_4_ = VK_STENCIL_OP_KEEP;
  local_150._0_4_ = VK_COMPARE_OP_NEVER;
  local_150._4_4_ = 1;
  local_148._0_4_ = 0;
  local_148._4_4_ = 0;
  uStack_140._0_4_ = 0.0;
  uStack_140._4_4_ = 0.0;
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0x3f80000000000000;
  local_1a0._32_8_ = local_e0;
  local_e0[0] = (uint)this->m_blendEnable;
  local_e0[1] = 6;
  local_e0[2] = VK_STENCIL_OP_ZERO;
  local_e0[3] = VK_STENCIL_OP_KEEP;
  local_e0[4] = VK_STENCIL_OP_INCREMENT_AND_WRAP;
  local_e0[5] = VK_COMPARE_OP_LESS;
  local_e0[6] = 0;
  local_e0[7] = 0xf;
  local_1a0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_1a0._8_8_ = (void *)0x0;
  local_1a0._16_4_ = 0;
  local_1a0._20_4_ = 0;
  local_1a0._24_4_ = 3;
  local_1a0._28_4_ = VK_COMPARE_OP_LESS;
  local_178._0_4_ = VK_STENCIL_OP_KEEP;
  local_178._4_4_ = VK_STENCIL_OP_KEEP;
  local_178._8_4_ = VK_STENCIL_OP_KEEP;
  local_178._12_4_ = VK_COMPARE_OP_NEVER;
  local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = (VkDynamicState *)0x0;
  local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (VkDynamicState *)0x0;
  pVVar6 = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  local_2b0 = vk;
  local_2a8 = device;
  if (!bVar7) {
    local_c0.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::
    _M_realloc_insert<vk::VkDynamicState>(&local_2f8,(iterator)0x0,&local_c0.sType);
    local_c0.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    if (local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::
      _M_realloc_insert<vk::VkDynamicState>
                (&local_2f8,
                 (iterator)
                 local_2f8.
                 super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl
                 .super__Vector_impl_data._M_finish,&local_c0.sType);
    }
    else {
      *local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl
       .super__Vector_impl_data._M_finish = VK_DYNAMIC_STATE_SCISSOR;
      local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  local_100._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_100._8_8_ = (void *)0x0;
  local_100._16_4_ = 0;
  local_c0.pDynamicState = (VkPipelineDynamicStateCreateInfo *)local_100;
  local_100._24_8_ =
       local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl
       .super__Vector_impl_data._M_start;
  if ((long)local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
            _M_impl.super__Vector_impl_data._M_start == 0) {
    local_c0.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pVVar6;
    local_100._24_8_ = pVVar6;
  }
  local_100._20_4_ =
       (undefined4)
       ((ulong)((long)local_2f8.
                      super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_2f8.
                     super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_c0.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_c0.pNext = (void *)0x0;
  local_c0.flags = VK_COMPARE_OP_NEVER;
  local_c0.pStages =
       (this->m_shaderStages).
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c0.stageCount =
       (int)((ulong)((long)(this->m_shaderStages).
                           super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)local_c0.pStages) >> 4
            ) * -0x55555555;
  local_c0.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)(local_2a0 + 0x28);
  local_c0.pInputAssemblyState = &local_248;
  local_c0.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_2a0;
  if ((this->m_shaderStageFlags & 2) == 0) {
    local_c0.pTessellationState = (VkPipelineTessellationStateCreateInfo *)pVVar6;
  }
  bVar7 = uVar5 == 0;
  local_c0.pViewportState = (VkPipelineViewportStateCreateInfo *)local_2e0;
  if (bVar7) {
    local_c0.pViewportState = (VkPipelineViewportStateCreateInfo *)pVVar6;
  }
  local_c0.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)(local_228 + 0x30);
  local_c0.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)local_228;
  if (bVar7) {
    local_c0.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)pVVar6;
  }
  local_c0.pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)(local_178 + 0x10);
  if (bVar7) {
    local_c0.pDepthStencilState = pVVar6;
  }
  local_c0.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)local_1a0;
  if (bVar7) {
    local_c0.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)pVVar6;
  }
  local_c0.subpass = 0;
  local_c0.basePipelineHandle.m_internal = 0;
  local_c0.basePipelineIndex = 0;
  local_c0.layout.m_internal = pipelineLayout.m_internal;
  local_c0.renderPass.m_internal = renderPass.m_internal;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,local_2b0,local_2a8,(VkPipelineCache)0x0,&local_c0,
             (VkAllocationCallbacks *)0x0);
  if ((VkPipelineDepthStencilStateCreateInfo *)
      local_2f8.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (VkPipelineDepthStencilStateCreateInfo *)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> GraphicsPipelineBuilder::build (const DeviceInterface&	vk,
												 const VkDevice			device,
												 const VkPipelineLayout	pipelineLayout,
												 const VkRenderPass		renderPass)
{
	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags       flags;
		static_cast<deUint32>(m_vertexInputBindings.size()),			// uint32_t                                    vertexBindingDescriptionCount;
		dataPointer(m_vertexInputBindings),								// const VkVertexInputBindingDescription*      pVertexBindingDescriptions;
		static_cast<deUint32>(m_vertexInputAttributes.size()),			// uint32_t                                    vertexAttributeDescriptionCount;
		dataPointer(m_vertexInputAttributes),							// const VkVertexInputAttributeDescription*    pVertexAttributeDescriptions;
	};

	const VkPrimitiveTopology topology = (m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST
																										 : m_primitiveTopology;
	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags     flags;
		topology,														// VkPrimitiveTopology                         topology;
		VK_FALSE,														// VkBool32                                    primitiveRestartEnable;
	};

	const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags      flags;
		m_patchControlPoints,											// uint32_t                                    patchControlPoints;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(m_renderSize.x()), static_cast<float>(m_renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor = {
		makeOffset2D(0, 0),
		makeExtent2D(m_renderSize.x(), m_renderSize.y()),
	};

	const bool haveRenderSize = m_renderSize.x() > 0 && m_renderSize.y() > 0;

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,												// const void*                                 pNext;
		(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags          flags;
		1u,														// uint32_t                                    viewportCount;
		haveRenderSize ? &viewport : DE_NULL,					// const VkViewport*                           pViewports;
		1u,														// uint32_t                                    scissorCount;
		haveRenderSize ? &scissor : DE_NULL,					// const VkRect2D*                             pScissors;
	};

	const bool isRasterizationDisabled = ((m_shaderStageFlags & VK_SHADER_STAGE_FRAGMENT_BIT) == 0);
	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType                          sType;
		DE_NULL,														// const void*                              pNext;
		(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,														// VkBool32                                 depthClampEnable;
		isRasterizationDisabled,										// VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
		m_cullModeFlags,												// VkCullModeFlags							cullMode;
		m_frontFace,													// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBiasConstantFactor;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									depthBiasSlopeFactor;
		1.0f,															// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
		VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,													// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		VK_FALSE,													// VkBool32									alphaToCoverageEnable;
		VK_FALSE													// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,		// stencil fail
		VK_STENCIL_OP_KEEP,		// depth & stencil pass
		VK_STENCIL_OP_KEEP,		// depth only fail
		VK_COMPARE_OP_NEVER,	// compare op
		0u,						// compare mask
		0u,						// write mask
		0u);					// reference

	const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
		VK_FALSE,													// VkBool32									depthTestEnable;
		VK_FALSE,													// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
		VK_FALSE,													// VkBool32									depthBoundsTestEnable;
		VK_FALSE,													// VkBool32									stencilTestEnable;
		stencilOpState,												// VkStencilOpState							front;
		stencilOpState,												// VkStencilOpState							back;
		0.0f,														// float									minDepthBounds;
		1.0f,														// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		m_blendEnable,						// VkBool32					blendEnable;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
		colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
		DE_NULL,													// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,													// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
		1u,															// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
	};

	std::vector<VkDynamicState> dynamicStates;
	if (!haveRenderSize)
	{
		dynamicStates.push_back(VK_DYNAMIC_STATE_VIEWPORT);
		dynamicStates.push_back(VK_DYNAMIC_STATE_SCISSOR);
	}

	const VkPipelineDynamicStateCreateInfo pipelineDynamicStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		0,														// VkPipelineDynamicStateCreateFlags	flags;
		static_cast<deUint32>(dynamicStates.size()),			// uint32_t								dynamicStateCount;
		(dynamicStates.empty() ? DE_NULL : &dynamicStates[0]),	// const VkDynamicState*				pDynamicStates;
	};

	const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
		DE_NULL,																// const void*										pNext;
		(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
		static_cast<deUint32>(m_shaderStages.size()),							// deUint32											stageCount;
		&m_shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
		&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
		&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
		(m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? &pipelineTessellationStateInfo : DE_NULL), // const VkPipelineTessellationStateCreateInfo*		pTessellationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineViewportStateInfo),		// const VkPipelineViewportStateCreateInfo*			pViewportState;
		&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineMultisampleStateInfo),	// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
		(isRasterizationDisabled ? DE_NULL : &pipelineDepthStencilStateInfo),	// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
		(isRasterizationDisabled ? DE_NULL : &pipelineColorBlendStateInfo),		// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
		(dynamicStates.empty() ? DE_NULL : &pipelineDynamicStateInfo),			// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
		pipelineLayout,															// VkPipelineLayout									layout;
		renderPass,																// VkRenderPass										renderPass;
		0u,																		// deUint32											subpass;
		DE_NULL,																// VkPipeline										basePipelineHandle;
		0,																		// deInt32											basePipelineIndex;
	};

	return createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
}